

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBaseRunner.cpp
# Opt level: O0

void __thiscall
xmrig::OclBaseRunner::OclBaseRunner(OclBaseRunner *this,size_t id,OclLaunchData *data)

{
  cl_uint cVar1;
  uint32_t uVar2;
  _func_int **pp_Var3;
  String *pSVar4;
  char *pcVar5;
  _func_int **in_RDX;
  _func_int **in_RSI;
  IOclRunner *in_RDI;
  cl_uint in_stack_ffffffffffffff38;
  cl_device_info in_stack_ffffffffffffff3c;
  String *in_stack_ffffffffffffff40;
  OclPlatform *in_stack_ffffffffffffff48;
  String local_48;
  String local_38 [2];
  _func_int **local_18;
  _func_int **local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  IOclRunner::IOclRunner(in_RDI);
  in_RDI->_vptr_IOclRunner = (_func_int **)&PTR__OclBaseRunner_002b8198;
  in_RDI[1]._vptr_IOclRunner = (_func_int **)0x0;
  in_RDI[2]._vptr_IOclRunner = (_func_int **)*local_18;
  in_RDI[3]._vptr_IOclRunner = (_func_int **)0x0;
  in_RDI[4]._vptr_IOclRunner = (_func_int **)0x0;
  in_RDI[5]._vptr_IOclRunner = (_func_int **)0x0;
  in_RDI[6]._vptr_IOclRunner = (_func_int **)0x0;
  pp_Var3 = (_func_int **)OclSource::get();
  in_RDI[7]._vptr_IOclRunner = pp_Var3;
  in_RDI[8]._vptr_IOclRunner = local_18;
  OclDevice::id((OclDevice *)(local_18 + 4));
  cVar1 = OclLib::getUint((cl_device_id)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
  in_RDI[9]._vptr_IOclRunner = (_func_int **)(ulong)cVar1;
  in_RDI[10]._vptr_IOclRunner = local_10;
  uVar2 = OclThread::intensity((OclThread *)(local_18 + 0x13));
  *(uint32_t *)&in_RDI[0xb]._vptr_IOclRunner = uVar2;
  in_RDI[0xc]._vptr_IOclRunner = (_func_int **)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::string((string *)(in_RDI + 0x11));
  pSVar4 = OclDevice::name((OclDevice *)(local_18 + 4));
  pcVar5 = String::operator_cast_to_char_(pSVar4);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),pcVar5);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xd),":");
  OclPlatform::version(in_stack_ffffffffffffff48);
  pcVar5 = String::operator_cast_to_char_(local_38);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xd),pcVar5);
  String::~String(in_stack_ffffffffffffff40);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xd),":");
  OclDevice::id((OclDevice *)(local_18 + 4));
  pSVar4 = &local_48;
  OclLib::getString((cl_device_id)in_stack_ffffffffffffff48,(cl_device_info)((ulong)pSVar4 >> 0x20))
  ;
  pcVar5 = String::operator_cast_to_char_(pSVar4);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xd),pcVar5);
  String::~String(pSVar4);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xd),":64");
  return;
}

Assistant:

xmrig::OclBaseRunner::OclBaseRunner(size_t id, const OclLaunchData &data) :
    m_ctx(data.ctx),
    m_source(OclSource::get()),
    m_data(data),
    m_align(OclLib::getUint(data.device.id(), CL_DEVICE_MEM_BASE_ADDR_ALIGN)),
    m_threadId(id),
    m_intensity(data.thread.intensity())
{
    m_deviceKey = data.device.name();

#   ifdef XMRIG_STRICT_OPENCL_CACHE
    m_deviceKey += ":";
    m_deviceKey += data.platform.version();

    m_deviceKey += ":";
    m_deviceKey += OclLib::getString(data.device.id(), CL_DRIVER_VERSION);
#   endif

#   if defined(__x86_64__) || defined(_M_AMD64) || defined (__arm64__) || defined (__aarch64__)
    m_deviceKey += ":64";
#   endif
}